

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersector1<8,_1048576,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  Geometry *this;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  byte bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  StackItemT<embree::NodeRefPtr<8>_> *pSVar40;
  bool bVar41;
  long lVar42;
  ulong *puVar43;
  byte bVar44;
  byte bVar45;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar46;
  size_t sVar47;
  long lVar48;
  long lVar49;
  bool bVar50;
  undefined1 auVar51 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar81 [64];
  long lStack_2500;
  undefined1 local_24e8 [16];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 auVar52 [32];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr == 8) {
    return false;
  }
  stack[0].dist = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_24e8 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar5 = (context->query_radius).field_0;
    local_24e8 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
  }
  pSVar46 = stack + 1;
  fVar1 = (query->p).field_0.field_0.x;
  auVar76._4_4_ = fVar1;
  auVar76._0_4_ = fVar1;
  auVar76._8_4_ = fVar1;
  auVar76._12_4_ = fVar1;
  auVar76._16_4_ = fVar1;
  auVar76._20_4_ = fVar1;
  auVar76._24_4_ = fVar1;
  auVar76._28_4_ = fVar1;
  fVar2 = (query->p).field_0.field_0.y;
  auVar77._4_4_ = fVar2;
  auVar77._0_4_ = fVar2;
  auVar77._8_4_ = fVar2;
  auVar77._12_4_ = fVar2;
  auVar77._16_4_ = fVar2;
  auVar77._20_4_ = fVar2;
  auVar77._24_4_ = fVar2;
  auVar77._28_4_ = fVar2;
  fVar3 = (query->p).field_0.field_0.z;
  auVar78._4_4_ = fVar3;
  auVar78._0_4_ = fVar3;
  auVar78._8_4_ = fVar3;
  auVar78._12_4_ = fVar3;
  auVar78._16_4_ = fVar3;
  auVar78._20_4_ = fVar3;
  auVar78._24_4_ = fVar3;
  auVar78._28_4_ = fVar3;
  uVar4 = *(undefined4 *)&(context->query_radius).field_0;
  auVar59._4_4_ = uVar4;
  auVar59._0_4_ = uVar4;
  auVar59._8_4_ = uVar4;
  auVar59._12_4_ = uVar4;
  auVar59._16_4_ = uVar4;
  auVar59._20_4_ = uVar4;
  auVar59._24_4_ = uVar4;
  auVar59._28_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar65._4_4_ = uVar4;
  auVar65._0_4_ = uVar4;
  auVar65._8_4_ = uVar4;
  auVar65._12_4_ = uVar4;
  auVar65._16_4_ = uVar4;
  auVar65._20_4_ = uVar4;
  auVar65._24_4_ = uVar4;
  auVar65._28_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar54._4_4_ = uVar4;
  auVar54._0_4_ = uVar4;
  auVar54._8_4_ = uVar4;
  auVar54._12_4_ = uVar4;
  auVar54._16_4_ = uVar4;
  auVar54._20_4_ = uVar4;
  auVar54._24_4_ = uVar4;
  auVar54._28_4_ = uVar4;
  bVar41 = false;
  auVar26 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar79 = ZEXT3264(auVar26);
  auVar80 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
LAB_01c77949:
  auVar26 = vsubps_avx(auVar76,auVar59);
  fVar16 = auVar59._0_4_;
  fVar17 = auVar59._4_4_;
  fVar18 = auVar59._8_4_;
  fVar19 = auVar59._12_4_;
  fVar20 = auVar59._16_4_;
  fVar21 = auVar59._20_4_;
  fVar22 = auVar59._24_4_;
  auVar23 = vsubps_avx(auVar77,auVar65);
  auVar24 = vsubps_avx(auVar78,auVar54);
  auVar66._0_4_ = fVar3 + auVar54._0_4_;
  auVar66._4_4_ = fVar3 + auVar54._4_4_;
  auVar66._8_4_ = fVar3 + auVar54._8_4_;
  auVar66._12_4_ = fVar3 + auVar54._12_4_;
  auVar66._16_4_ = fVar3 + auVar54._16_4_;
  auVar66._20_4_ = fVar3 + auVar54._20_4_;
  auVar66._24_4_ = fVar3 + auVar54._24_4_;
  auVar66._28_4_ = fVar3 + auVar54._28_4_;
  auVar81._0_4_ = fVar16 * fVar16;
  auVar81._4_4_ = fVar17 * fVar17;
  auVar81._8_4_ = fVar18 * fVar18;
  auVar81._12_4_ = fVar19 * fVar19;
  auVar81._16_4_ = fVar20 * fVar20;
  auVar81._20_4_ = fVar21 * fVar21;
  auVar81._28_36_ = in_ZMM15._28_36_;
  auVar81._24_4_ = fVar22 * fVar22;
LAB_01c7799e:
  do {
    if (pSVar46 == stack) {
      return bVar41;
    }
    pSVar40 = pSVar46 + -1;
    pSVar46 = pSVar46 + -1;
  } while ((float)local_24e8._0_4_ < (float)pSVar40->dist);
  sVar47 = (pSVar46->ptr).ptr;
LAB_01c779bc:
  do {
    do {
      if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
        if ((sVar47 & 8) != 0) {
LAB_01c77eca:
          lVar48 = (sVar47 & 0xfffffffffffffff0) + 0xa0;
          bVar44 = 0;
          lVar42 = 0;
          goto LAB_01c77eee;
        }
        puVar43 = (ulong *)((sVar47 & 0xfffffffffffffff0) + 0x40);
        if ((sVar47 & 0xfffffffffffffff0) == 0) {
          puVar43 = (ulong *)0x0;
        }
        uVar4 = (undefined4)puVar43[6];
        auVar60._4_4_ = uVar4;
        auVar60._0_4_ = uVar4;
        auVar60._8_4_ = uVar4;
        auVar60._12_4_ = uVar4;
        auVar60._16_4_ = uVar4;
        auVar60._20_4_ = uVar4;
        auVar60._24_4_ = uVar4;
        auVar60._28_4_ = uVar4;
        uVar4 = *(undefined4 *)((long)puVar43 + 0x3c);
        auVar67._4_4_ = uVar4;
        auVar67._0_4_ = uVar4;
        auVar67._8_4_ = uVar4;
        auVar67._12_4_ = uVar4;
        auVar67._16_4_ = uVar4;
        auVar67._20_4_ = uVar4;
        auVar67._24_4_ = uVar4;
        auVar67._28_4_ = uVar4;
        auVar70._8_8_ = 0;
        auVar70._0_8_ = *puVar43;
        auVar54 = vpmovzxbd_avx2(auVar70);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar36 = vfmadd213ps_fma(auVar54,auVar67,auVar60);
        auVar73._8_8_ = 0;
        auVar73._0_8_ = puVar43[1];
        auVar54 = vpmovzxbd_avx2(auVar73);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar37 = vfmadd213ps_fma(auVar54,auVar67,auVar60);
        uVar4 = *(undefined4 *)((long)puVar43 + 0x34);
        auVar61._4_4_ = uVar4;
        auVar61._0_4_ = uVar4;
        auVar61._8_4_ = uVar4;
        auVar61._12_4_ = uVar4;
        auVar61._16_4_ = uVar4;
        auVar61._20_4_ = uVar4;
        auVar61._24_4_ = uVar4;
        auVar61._28_4_ = uVar4;
        uVar4 = (undefined4)puVar43[8];
        auVar68._4_4_ = uVar4;
        auVar68._0_4_ = uVar4;
        auVar68._8_4_ = uVar4;
        auVar68._12_4_ = uVar4;
        auVar68._16_4_ = uVar4;
        auVar68._20_4_ = uVar4;
        auVar68._24_4_ = uVar4;
        auVar68._28_4_ = uVar4;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = puVar43[2];
        auVar54 = vpmovzxbd_avx2(auVar6);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar38 = vfmadd213ps_fma(auVar54,auVar68,auVar61);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = puVar43[3];
        auVar54 = vpmovzxbd_avx2(auVar7);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar39 = vfmadd213ps_fma(auVar54,auVar68,auVar61);
        uVar4 = (undefined4)puVar43[7];
        auVar62._4_4_ = uVar4;
        auVar62._0_4_ = uVar4;
        auVar62._8_4_ = uVar4;
        auVar62._12_4_ = uVar4;
        auVar62._16_4_ = uVar4;
        auVar62._20_4_ = uVar4;
        auVar62._24_4_ = uVar4;
        auVar62._28_4_ = uVar4;
        uVar4 = *(undefined4 *)((long)puVar43 + 0x44);
        auVar69._4_4_ = uVar4;
        auVar69._0_4_ = uVar4;
        auVar69._8_4_ = uVar4;
        auVar69._12_4_ = uVar4;
        auVar69._16_4_ = uVar4;
        auVar69._20_4_ = uVar4;
        auVar69._24_4_ = uVar4;
        auVar69._28_4_ = uVar4;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = puVar43[4];
        auVar54 = vpmovzxbd_avx2(auVar8);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar58 = vfmadd213ps_fma(auVar54,auVar69,auVar62);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = puVar43[5];
        auVar54 = vpmovzxbd_avx2(auVar9);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar64 = vfmadd213ps_fma(auVar54,auVar69,auVar62);
        auVar54 = vmaxps_avx(auVar76,ZEXT1632(auVar36));
        auVar54 = vminps_avx(auVar54,ZEXT1632(auVar37));
        auVar25 = vsubps_avx(auVar54,auVar76);
        auVar54 = vmaxps_avx(auVar77,ZEXT1632(auVar38));
        auVar54 = vminps_avx(auVar54,ZEXT1632(auVar39));
        auVar51 = vsubps_avx(auVar54,auVar77);
        auVar54 = vmaxps_avx(auVar78,ZEXT1632(auVar58));
        auVar54 = vminps_avx(auVar54,ZEXT1632(auVar64));
        auVar54 = vsubps_avx(auVar54,auVar78);
        auVar63._0_4_ =
             auVar25._0_4_ * auVar25._0_4_ + auVar51._0_4_ * auVar51._0_4_ +
             auVar54._0_4_ * auVar54._0_4_;
        auVar63._4_4_ =
             auVar25._4_4_ * auVar25._4_4_ + auVar51._4_4_ * auVar51._4_4_ +
             auVar54._4_4_ * auVar54._4_4_;
        auVar63._8_4_ =
             auVar25._8_4_ * auVar25._8_4_ + auVar51._8_4_ * auVar51._8_4_ +
             auVar54._8_4_ * auVar54._8_4_;
        auVar63._12_4_ =
             auVar25._12_4_ * auVar25._12_4_ + auVar51._12_4_ * auVar51._12_4_ +
             auVar54._12_4_ * auVar54._12_4_;
        auVar63._16_4_ =
             auVar25._16_4_ * auVar25._16_4_ + auVar51._16_4_ * auVar51._16_4_ +
             auVar54._16_4_ * auVar54._16_4_;
        auVar63._20_4_ =
             auVar25._20_4_ * auVar25._20_4_ + auVar51._20_4_ * auVar51._20_4_ +
             auVar54._20_4_ * auVar54._20_4_;
        auVar63._24_4_ =
             auVar25._24_4_ * auVar25._24_4_ + auVar51._24_4_ * auVar51._24_4_ +
             auVar54._24_4_ * auVar54._24_4_;
        auVar63._28_4_ = auVar25._28_4_ + auVar51._28_4_ + auVar51._28_4_;
        uVar27 = vcmpps_avx512vl(ZEXT1632(auVar36),ZEXT1632(auVar37),2);
        uVar33 = vpcmpub_avx512vl(auVar70,auVar73,2);
        uVar28 = vcmpps_avx512vl(auVar63,auVar81._0_32_,2);
        bVar44 = (byte)uVar27 & (byte)uVar28 & (byte)uVar33;
      }
      else {
        if ((sVar47 & 8) != 0) goto LAB_01c77eca;
        puVar43 = (ulong *)((sVar47 & 0xfffffffffffffff0) + 0x40);
        if ((sVar47 & 0xfffffffffffffff0) == 0) {
          puVar43 = (ulong *)0x0;
        }
        auVar58._8_8_ = 0;
        auVar58._0_8_ = *puVar43;
        auVar64._8_8_ = 0;
        auVar64._0_8_ = puVar43[1];
        uVar34 = vpcmpub_avx512vl(auVar58,auVar64,2);
        uVar4 = (undefined4)puVar43[6];
        auVar71._4_4_ = uVar4;
        auVar71._0_4_ = uVar4;
        auVar71._8_4_ = uVar4;
        auVar71._12_4_ = uVar4;
        auVar71._16_4_ = uVar4;
        auVar71._20_4_ = uVar4;
        auVar71._24_4_ = uVar4;
        auVar71._28_4_ = uVar4;
        uVar4 = *(undefined4 *)((long)puVar43 + 0x3c);
        auVar72._4_4_ = uVar4;
        auVar72._0_4_ = uVar4;
        auVar72._8_4_ = uVar4;
        auVar72._12_4_ = uVar4;
        auVar72._16_4_ = uVar4;
        auVar72._20_4_ = uVar4;
        auVar72._24_4_ = uVar4;
        auVar72._28_4_ = uVar4;
        auVar54 = vpmovzxbd_avx2(auVar58);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar58 = vfmadd213ps_fma(auVar54,auVar72,auVar71);
        auVar54 = vpmovzxbd_avx2(auVar64);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar64 = vfmadd213ps_fma(auVar54,auVar72,auVar71);
        uVar4 = *(undefined4 *)((long)puVar43 + 0x34);
        auVar52._4_4_ = uVar4;
        auVar52._0_4_ = uVar4;
        auVar52._8_4_ = uVar4;
        auVar52._12_4_ = uVar4;
        auVar52._16_4_ = uVar4;
        auVar52._20_4_ = uVar4;
        auVar52._24_4_ = uVar4;
        auVar52._28_4_ = uVar4;
        uVar4 = (undefined4)puVar43[8];
        auVar57._4_4_ = uVar4;
        auVar57._0_4_ = uVar4;
        auVar57._8_4_ = uVar4;
        auVar57._12_4_ = uVar4;
        auVar57._16_4_ = uVar4;
        auVar57._20_4_ = uVar4;
        auVar57._24_4_ = uVar4;
        auVar57._28_4_ = uVar4;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = puVar43[2];
        auVar54 = vpmovzxbd_avx2(auVar36);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar36 = vfmadd213ps_fma(auVar54,auVar57,auVar52);
        auVar37._8_8_ = 0;
        auVar37._0_8_ = puVar43[3];
        auVar54 = vpmovzxbd_avx2(auVar37);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar37 = vfmadd213ps_fma(auVar54,auVar57,auVar52);
        uVar4 = (undefined4)puVar43[7];
        auVar55._4_4_ = uVar4;
        auVar55._0_4_ = uVar4;
        auVar55._8_4_ = uVar4;
        auVar55._12_4_ = uVar4;
        auVar55._16_4_ = uVar4;
        auVar55._20_4_ = uVar4;
        auVar55._24_4_ = uVar4;
        auVar55._28_4_ = uVar4;
        uVar4 = *(undefined4 *)((long)puVar43 + 0x44);
        auVar56._4_4_ = uVar4;
        auVar56._0_4_ = uVar4;
        auVar56._8_4_ = uVar4;
        auVar56._12_4_ = uVar4;
        auVar56._16_4_ = uVar4;
        auVar56._20_4_ = uVar4;
        auVar56._24_4_ = uVar4;
        auVar56._28_4_ = uVar4;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = puVar43[4];
        auVar54 = vpmovzxbd_avx2(auVar38);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar38 = vfmadd213ps_fma(auVar54,auVar56,auVar55);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = puVar43[5];
        auVar54 = vpmovzxbd_avx2(auVar39);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar39 = vfmadd213ps_fma(auVar54,auVar56,auVar55);
        auVar52 = ZEXT1632(auVar58);
        auVar54 = vmaxps_avx(auVar76,auVar52);
        auVar54 = vminps_avx(auVar54,ZEXT1632(auVar64));
        auVar25 = vsubps_avx(auVar54,auVar76);
        auVar54 = vmaxps_avx(auVar77,ZEXT1632(auVar36));
        auVar54 = vminps_avx(auVar54,ZEXT1632(auVar37));
        auVar51 = vsubps_avx(auVar54,auVar77);
        auVar54 = vmaxps_avx(auVar78,ZEXT1632(auVar38));
        auVar54 = vminps_avx(auVar54,ZEXT1632(auVar39));
        auVar54 = vsubps_avx(auVar54,auVar78);
        auVar63._0_4_ =
             auVar25._0_4_ * auVar25._0_4_ + auVar51._0_4_ * auVar51._0_4_ +
             auVar54._0_4_ * auVar54._0_4_;
        auVar63._4_4_ =
             auVar25._4_4_ * auVar25._4_4_ + auVar51._4_4_ * auVar51._4_4_ +
             auVar54._4_4_ * auVar54._4_4_;
        auVar63._8_4_ =
             auVar25._8_4_ * auVar25._8_4_ + auVar51._8_4_ * auVar51._8_4_ +
             auVar54._8_4_ * auVar54._8_4_;
        auVar63._12_4_ =
             auVar25._12_4_ * auVar25._12_4_ + auVar51._12_4_ * auVar51._12_4_ +
             auVar54._12_4_ * auVar54._12_4_;
        auVar63._16_4_ =
             auVar25._16_4_ * auVar25._16_4_ + auVar51._16_4_ * auVar51._16_4_ +
             auVar54._16_4_ * auVar54._16_4_;
        auVar63._20_4_ =
             auVar25._20_4_ * auVar25._20_4_ + auVar51._20_4_ * auVar51._20_4_ +
             auVar54._20_4_ * auVar54._20_4_;
        auVar63._24_4_ =
             auVar25._24_4_ * auVar25._24_4_ + auVar51._24_4_ * auVar51._24_4_ +
             auVar54._24_4_ * auVar54._24_4_;
        auVar63._28_4_ = auVar25._28_4_ + auVar51._28_4_ + auVar51._28_4_;
        uVar27 = vcmpps_avx512vl(ZEXT1632(auVar64),auVar26,1);
        auVar51._4_4_ = fVar1 + fVar17;
        auVar51._0_4_ = fVar1 + fVar16;
        auVar51._8_4_ = fVar1 + fVar18;
        auVar51._12_4_ = fVar1 + fVar19;
        auVar51._16_4_ = fVar1 + fVar20;
        auVar51._20_4_ = fVar1 + fVar21;
        auVar51._24_4_ = fVar1 + fVar22;
        auVar51._28_4_ = fVar1 + auVar59._28_4_;
        uVar28 = vcmpps_avx512vl(auVar52,auVar51,6);
        auVar25._4_4_ = fVar2 + auVar65._4_4_;
        auVar25._0_4_ = fVar2 + auVar65._0_4_;
        auVar25._8_4_ = fVar2 + auVar65._8_4_;
        auVar25._12_4_ = fVar2 + auVar65._12_4_;
        auVar25._16_4_ = fVar2 + auVar65._16_4_;
        auVar25._20_4_ = fVar2 + auVar65._20_4_;
        auVar25._24_4_ = fVar2 + auVar65._24_4_;
        auVar25._28_4_ = fVar2 + auVar65._28_4_;
        uVar33 = vcmpps_avx512vl(ZEXT1632(auVar36),auVar25,6);
        uVar29 = vcmpps_avx512vl(ZEXT1632(auVar37),auVar23,1);
        uVar30 = vcmpps_avx512vl(ZEXT1632(auVar39),auVar24,1);
        uVar31 = vcmpps_avx512vl(ZEXT1632(auVar38),auVar66,6);
        uVar32 = vcmpps_avx512vl(auVar52,ZEXT1632(auVar64),2);
        bVar44 = (byte)uVar34 & (byte)uVar32 &
                 ~((byte)uVar28 | (byte)uVar27 | (byte)uVar33 | (byte)uVar29 | (byte)uVar31 |
                  (byte)uVar30);
      }
      if (bVar44 == 0) goto LAB_01c7799e;
      auVar54 = *(undefined1 (*) [32])(sVar47 & 0xfffffffffffffff0);
      auVar25 = ((undefined1 (*) [32])(sVar47 & 0xfffffffffffffff0))[1];
      auVar51 = vpternlogd_avx512vl(auVar79._0_32_,auVar63,auVar80._0_32_,0xf8);
      auVar52 = vpcompressd_avx512vl(auVar51);
      auVar53._0_4_ = (uint)(bVar44 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar44 & 1) * auVar51._0_4_
      ;
      bVar50 = (bool)(bVar44 >> 1 & 1);
      auVar53._4_4_ = (uint)bVar50 * auVar52._4_4_ | (uint)!bVar50 * auVar51._4_4_;
      bVar50 = (bool)(bVar44 >> 2 & 1);
      auVar53._8_4_ = (uint)bVar50 * auVar52._8_4_ | (uint)!bVar50 * auVar51._8_4_;
      bVar50 = (bool)(bVar44 >> 3 & 1);
      auVar53._12_4_ = (uint)bVar50 * auVar52._12_4_ | (uint)!bVar50 * auVar51._12_4_;
      bVar50 = (bool)(bVar44 >> 4 & 1);
      auVar53._16_4_ = (uint)bVar50 * auVar52._16_4_ | (uint)!bVar50 * auVar51._16_4_;
      bVar50 = (bool)(bVar44 >> 5 & 1);
      auVar53._20_4_ = (uint)bVar50 * auVar52._20_4_ | (uint)!bVar50 * auVar51._20_4_;
      bVar50 = (bool)(bVar44 >> 6 & 1);
      auVar53._24_4_ = (uint)bVar50 * auVar52._24_4_ | (uint)!bVar50 * auVar51._24_4_;
      auVar53._28_4_ =
           (uint)(bVar44 >> 7) * auVar52._28_4_ | (uint)!(bool)(bVar44 >> 7) * auVar51._28_4_;
      auVar51 = vpermt2q_avx512vl(auVar54,auVar53,auVar25);
      sVar47 = auVar51._0_8_;
      bVar44 = bVar44 - 1 & bVar44;
    } while (bVar44 == 0);
    auVar51 = vpshufd_avx2(auVar53,0x55);
    vpermt2q_avx512vl(auVar54,auVar51,auVar25);
    auVar52 = vpminsd_avx2(auVar53,auVar51);
    auVar51 = vpmaxsd_avx2(auVar53,auVar51);
    bVar44 = bVar44 - 1 & bVar44;
    if (bVar44 == 0) {
      auVar52 = vpermi2q_avx512vl(auVar52,auVar54,auVar25);
      sVar47 = auVar52._0_8_;
      auVar54 = vpermt2q_avx512vl(auVar54,auVar51,auVar25);
      (pSVar46->ptr).ptr = auVar54._0_8_;
      lVar42 = 8;
      lStack_2500 = 0x10;
LAB_01c77cbc:
      auVar54 = vpermd_avx2(auVar51,auVar63);
      *(int *)((long)&(pSVar46->ptr).ptr + lVar42) = auVar54._0_4_;
      pSVar46 = (StackItemT<embree::NodeRefPtr<8>_> *)((long)&(pSVar46->ptr).ptr + lStack_2500);
      goto LAB_01c779bc;
    }
    auVar71 = vpshufd_avx2(auVar53,0xaa);
    vpermt2q_avx512vl(auVar54,auVar71,auVar25);
    auVar55 = vpminsd_avx2(auVar52,auVar71);
    auVar52 = vpmaxsd_avx2(auVar52,auVar71);
    auVar71 = vpminsd_avx2(auVar51,auVar52);
    auVar52 = vpmaxsd_avx2(auVar51,auVar52);
    bVar44 = bVar44 - 1 & bVar44;
    if (bVar44 == 0) {
      auVar51 = vpermi2q_avx512vl(auVar55,auVar54,auVar25);
      sVar47 = auVar51._0_8_;
      auVar51 = vpermt2q_avx512vl(auVar54,auVar52,auVar25);
      (pSVar46->ptr).ptr = auVar51._0_8_;
      auVar51 = vpermd_avx2(auVar52,auVar63);
      pSVar46->dist = auVar51._0_4_;
      auVar54 = vpermt2q_avx512vl(auVar54,auVar71,auVar25);
      pSVar46[1].ptr.ptr = auVar54._0_8_;
      lStack_2500 = 0x18;
      lVar42 = lStack_2500;
      lStack_2500 = 0x20;
      auVar51 = auVar71;
      goto LAB_01c77cbc;
    }
    auVar51 = vpshufd_avx2(auVar53,0xff);
    vpermt2q_avx512vl(auVar54,auVar51,auVar25);
    auVar57 = vpminsd_avx2(auVar55,auVar51);
    auVar55 = vpmaxsd_avx2(auVar55,auVar51);
    auVar51 = vpminsd_avx2(auVar71,auVar55);
    auVar55 = vpmaxsd_avx2(auVar71,auVar55);
    auVar71 = vpminsd_avx2(auVar52,auVar55);
    auVar52 = vpmaxsd_avx2(auVar52,auVar55);
    bVar44 = bVar44 - 1 & bVar44;
    if (bVar44 == 0) {
      auVar55 = vpermi2q_avx512vl(auVar57,auVar54,auVar25);
      sVar47 = auVar55._0_8_;
      auVar55 = vpermt2q_avx512vl(auVar54,auVar52,auVar25);
      (pSVar46->ptr).ptr = auVar55._0_8_;
      auVar52 = vpermd_avx2(auVar52,auVar63);
      pSVar46->dist = auVar52._0_4_;
      auVar52 = vpermt2q_avx512vl(auVar54,auVar71,auVar25);
      pSVar46[1].ptr.ptr = auVar52._0_8_;
      auVar52 = vpermd_avx2(auVar71,auVar63);
      pSVar46[1].dist = auVar52._0_4_;
      auVar54 = vpermt2q_avx512vl(auVar54,auVar51,auVar25);
      pSVar46[2].ptr.ptr = auVar54._0_8_;
      lVar42 = 0x28;
      lStack_2500 = 0x30;
      goto LAB_01c77cbc;
    }
    auVar56 = valignd_avx512vl(auVar53,auVar53,3);
    auVar55 = vpmovsxbd_avx2(ZEXT816(0x303020108));
    auVar57 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                   CONCAT48(0x80000000,0x8000000080000000))),auVar55
                                ,auVar57);
    auVar55 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
    auVar51 = vpermt2d_avx512vl(auVar57,auVar55,auVar51);
    auVar55 = vpermt2d_avx512vl(auVar51,auVar55,auVar71);
    auVar51 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
    auVar51 = vpermt2d_avx512vl(auVar55,auVar51,auVar52);
    auVar75 = ZEXT3264(auVar51);
    bVar45 = bVar44;
    do {
      auVar52 = auVar75._0_32_;
      auVar74._8_4_ = 1;
      auVar74._0_8_ = 0x100000001;
      auVar74._12_4_ = 1;
      auVar74._16_4_ = 1;
      auVar74._20_4_ = 1;
      auVar74._24_4_ = 1;
      auVar74._28_4_ = 1;
      auVar51 = vpermd_avx2(auVar74,auVar56);
      auVar56 = valignd_avx512vl(auVar56,auVar56,1);
      vpermt2q_avx512vl(auVar54,auVar56,auVar25);
      bVar45 = bVar45 - 1 & bVar45;
      uVar27 = vpcmpd_avx512vl(auVar51,auVar52,5);
      auVar51 = vpmaxsd_avx2(auVar51,auVar52);
      bVar35 = (byte)uVar27 << 1;
      auVar52 = valignd_avx512vl(auVar52,auVar52,7);
      bVar50 = (bool)((byte)uVar27 & 1);
      bVar11 = (bool)(bVar35 >> 2 & 1);
      bVar12 = (bool)(bVar35 >> 3 & 1);
      bVar13 = (bool)(bVar35 >> 4 & 1);
      bVar14 = (bool)(bVar35 >> 5 & 1);
      bVar15 = (bool)(bVar35 >> 6 & 1);
      auVar75 = ZEXT3264(CONCAT428((uint)(bVar35 >> 7) * auVar52._28_4_ |
                                   (uint)!(bool)(bVar35 >> 7) * auVar51._28_4_,
                                   CONCAT424((uint)bVar15 * auVar52._24_4_ |
                                             (uint)!bVar15 * auVar51._24_4_,
                                             CONCAT420((uint)bVar14 * auVar52._20_4_ |
                                                       (uint)!bVar14 * auVar51._20_4_,
                                                       CONCAT416((uint)bVar13 * auVar52._16_4_ |
                                                                 (uint)!bVar13 * auVar51._16_4_,
                                                                 CONCAT412((uint)bVar12 *
                                                                           auVar52._12_4_ |
                                                                           (uint)!bVar12 *
                                                                           auVar51._12_4_,
                                                                           CONCAT48((uint)bVar11 *
                                                                                    auVar52._8_4_ |
                                                                                    (uint)!bVar11 *
                                                                                    auVar51._8_4_,
                                                                                    CONCAT44((uint)
                                                  bVar50 * auVar52._4_4_ |
                                                  (uint)!bVar50 * auVar51._4_4_,auVar51._0_4_)))))))
                        );
    } while (bVar45 != 0);
    lVar42 = (ulong)(uint)POPCOUNT((uint)bVar44) + 3;
    while( true ) {
      auVar52 = auVar75._0_32_;
      auVar51 = vpermt2q_avx512vl(auVar54,auVar52,auVar25);
      sVar47 = auVar51._0_8_;
      bVar50 = lVar42 == 0;
      lVar42 = lVar42 + -1;
      if (bVar50) break;
      (pSVar46->ptr).ptr = sVar47;
      auVar51 = vpermd_avx2(auVar52,auVar63);
      pSVar46->dist = auVar51._0_4_;
      auVar51 = valignd_avx512vl(auVar52,auVar52,1);
      auVar75 = ZEXT3264(auVar51);
      pSVar46 = pSVar46 + 1;
    }
  } while( true );
LAB_01c77eee:
  in_ZMM15 = ZEXT3264(auVar81._0_32_);
  if (lVar42 == (ulong)((uint)sVar47 & 0xf) - 8) goto LAB_01c77f94;
  bVar45 = 0;
  for (lVar49 = -0x10; lVar49 != 0; lVar49 = lVar49 + 4) {
    uVar10 = *(uint *)(lVar48 + lVar49);
    if ((ulong)uVar10 == 0xffffffff) break;
    this = (context->scene->geometries).items[uVar10].ptr;
    context->geomID = uVar10;
    context->primID = *(uint *)(lVar48 + 0x10 + lVar49);
    bVar50 = Geometry::pointQuery(this,query,context);
    bVar45 = bVar45 | bVar50;
  }
  bVar44 = bVar44 | bVar45;
  lVar42 = lVar42 + 1;
  lVar48 = lVar48 + 0xb0;
  auVar54 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar79 = ZEXT3264(auVar54);
  auVar80 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  goto LAB_01c77eee;
LAB_01c77f94:
  if (bVar44 != 0) goto code_r0x01c77fab;
  goto LAB_01c7799e;
code_r0x01c77fab:
  uVar4 = *(undefined4 *)&(context->query_radius).field_0;
  auVar59._4_4_ = uVar4;
  auVar59._0_4_ = uVar4;
  auVar59._8_4_ = uVar4;
  auVar59._12_4_ = uVar4;
  auVar59._16_4_ = uVar4;
  auVar59._20_4_ = uVar4;
  auVar59._24_4_ = uVar4;
  auVar59._28_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar65._4_4_ = uVar4;
  auVar65._0_4_ = uVar4;
  auVar65._8_4_ = uVar4;
  auVar65._12_4_ = uVar4;
  auVar65._16_4_ = uVar4;
  auVar65._20_4_ = uVar4;
  auVar65._24_4_ = uVar4;
  auVar65._28_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar54._4_4_ = uVar4;
  auVar54._0_4_ = uVar4;
  auVar54._8_4_ = uVar4;
  auVar54._12_4_ = uVar4;
  auVar54._16_4_ = uVar4;
  auVar54._20_4_ = uVar4;
  auVar54._24_4_ = uVar4;
  auVar54._28_4_ = uVar4;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_24e8 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar5 = (context->query_radius).field_0;
    local_24e8 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
  }
  bVar41 = true;
  goto LAB_01c77949;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }